

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O2

double QuakePower(double factor,double intensity,double offset)

{
  double dVar1;
  
  dVar1 = 0.0;
  if ((intensity != 0.0) || (NAN(intensity))) {
    dVar1 = FRandom::GenRand_Real2(&pr_torchflicker);
    dVar1 = (intensity + intensity) * dVar1 - intensity;
  }
  return (dVar1 + offset) * factor;
}

Assistant:

static double QuakePower(double factor, double intensity, double offset)
{ 
	double randumb;
	if (intensity == 0)
	{
		randumb = 0;
	}
	else
	{
		randumb = pr_torchflicker.GenRand_Real2() * (intensity * 2) - intensity;
	}
	return factor * (offset + randumb);
}